

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O2

EncodingResult<kj::String> *
kj::decodeCEscape(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char> text)

{
  uchar *puVar1;
  size_t sVar2;
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  Array<char> result_1;
  Array<char> local_58;
  EncodingResult<kj::Array<unsigned_char>_> result;
  
  text_00.ptr = (char *)text.size_;
  text_00.size_ = 1;
  decodeBinaryCEscape(&result,(kj *)text.ptr,text_00,in_R8B);
  sVar2 = result.super_Array<unsigned_char>.size_;
  puVar1 = result.super_Array<unsigned_char>.ptr;
  result_1.disposer = result.super_Array<unsigned_char>.disposer;
  result.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  result.super_Array<unsigned_char>.size_ = 0;
  local_58.disposer = result.super_Array<unsigned_char>.disposer;
  result_1.ptr = (char *)0x0;
  result_1.size_ = 0;
  (__return_storage_ptr__->super_String).content.ptr = (char *)puVar1;
  (__return_storage_ptr__->super_String).content.size_ = sVar2;
  (__return_storage_ptr__->super_String).content.disposer =
       result.super_Array<unsigned_char>.disposer;
  local_58.ptr = (char *)0x0;
  local_58.size_ = 0;
  __return_storage_ptr__->hadErrors = result.hadErrors;
  Array<char>::~Array(&local_58);
  Array<char>::~Array(&result_1);
  Array<unsigned_char>::~Array(&result.super_Array<unsigned_char>);
  return __return_storage_ptr__;
}

Assistant:

inline EncodingResult<String> decodeCEscape(ArrayPtr<const char> text) {
  auto result = decodeBinaryCEscape(text, true);
  return { String(result.releaseAsChars()), result.hadErrors };
}